

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,char *fromFile,char *toFile,MatchProperties *match_properties)

{
  cmCommand *pcVar1;
  bool bVar2;
  ostream *poVar3;
  allocator local_1c5;
  mode_t perm;
  string local_1c0;
  mode_t permissions;
  
  if (this->Always == false) {
    bVar2 = cmFileTimeComparison::FileTimesDiffer(&this->FileTimes,fromFile,toFile);
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,(ulong)bVar2);
    if (!bVar2) goto LAB_0035dfb5;
  }
  else {
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,1);
  }
  std::__cxx11::string::string((string *)&permissions,fromFile,(allocator *)&perm);
  std::__cxx11::string::string((string *)&local_1c0,toFile,&local_1c5);
  bVar2 = cmsys::SystemTools::CopyAFile((string *)&permissions,&local_1c0,true);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&permissions);
  if (bVar2) {
    if (this->Always == false) {
      perm = 0;
      bVar2 = cmsys::SystemTools::GetPermissions(toFile,&perm);
      if (bVar2) {
        cmsys::SystemTools::SetPermissions(toFile,perm | 0x80);
      }
      bVar2 = cmSystemTools::CopyFileTime(fromFile,toFile);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&permissions);
        poVar3 = std::operator<<((ostream *)&permissions,this->Name);
        poVar3 = std::operator<<(poVar3," cannot set modification time on \"");
        poVar3 = std::operator<<(poVar3,toFile);
        std::operator<<(poVar3,"\"");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar1,&local_1c0);
        goto LAB_0035e0cd;
      }
    }
LAB_0035dfb5:
    permissions = match_properties->Permissions;
    if (permissions == 0) {
      permissions = this->FilePermissions;
    }
    if (permissions == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,&permissions);
    }
    bVar2 = SetPermissions(this,toFile,permissions);
    return bVar2;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&permissions);
  poVar3 = std::operator<<((ostream *)&permissions,this->Name);
  poVar3 = std::operator<<(poVar3," cannot copy file \"");
  poVar3 = std::operator<<(poVar3,fromFile);
  poVar3 = std::operator<<(poVar3,"\" to \"");
  poVar3 = std::operator<<(poVar3,toFile);
  std::operator<<(poVar3,"\".");
  pcVar1 = &this->FileCommand->super_cmCommand;
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(pcVar1,&local_1c0);
LAB_0035e0cd:
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&permissions);
  return false;
}

Assistant:

bool cmFileCopier::InstallFile(const char* fromFile, const char* toFile,
                               MatchProperties const& match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if(!this->Always)
    {
    // If both files exist with the same time do not copy.
    if(!this->FileTimes.FileTimesDiffer(fromFile, toFile))
      {
      copy = false;
      }
    }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if(copy && !cmSystemTools::CopyAFile(fromFile, toFile, true))
    {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile
      << "\" to \"" << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Set the file modification time of the destination file.
  if(copy && !this->Always)
    {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if(cmSystemTools::GetPermissions(toFile, perm))
      {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
      }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile))
      {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \""
        << toFile << "\"";
      this->FileCommand->SetError(e.str());
      return false;
      }
    }

  // Set permissions of the destination file.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->FilePermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
    }
  return this->SetPermissions(toFile, permissions);
}